

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

void __thiscall
vkt::texture::util::TextureRenderer::addCubeTexture
          (TextureRenderer *this,TestTextureCubeSp *texture)

{
  Context *context;
  TextureBinding *this_00;
  TestTextureSp local_40;
  SharedPtr<vkt::texture::util::TextureBinding> local_30;
  
  this_00 = (TextureBinding *)operator_new(0x70);
  context = this->m_context;
  local_40.m_ptr = &texture->m_ptr->super_TestTexture;
  local_40.m_state = texture->m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  TextureBinding::TextureBinding(this_00,context,&local_40,TYPE_CUBE_MAP);
  de::SharedPtr<vkt::texture::util::TextureBinding>::SharedPtr(&local_30,this_00);
  std::
  vector<de::SharedPtr<vkt::texture::util::TextureBinding>,std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>>>
  ::emplace_back<de::SharedPtr<vkt::texture::util::TextureBinding>>
            ((vector<de::SharedPtr<vkt::texture::util::TextureBinding>,std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>>>
              *)&this->m_textureBindings,&local_30);
  de::SharedPtr<vkt::texture::util::TextureBinding>::release(&local_30);
  de::SharedPtr<vkt::pipeline::TestTexture>::~SharedPtr(&local_40);
  return;
}

Assistant:

void TextureRenderer::addCubeTexture (const TestTextureCubeSp& texture)
{
	m_textureBindings.push_back(TextureBindingSp(new TextureBinding(m_context, texture, TextureBinding::TYPE_CUBE_MAP)));
}